

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void ConvertARGBToY_SSE2(uint32_t *argb,uint8_t *y,int width)

{
  uint8_t *puVar1;
  uint uVar2;
  long lVar3;
  uint32_t *argb_00;
  __m128i Y1;
  __m128i Y0;
  __m128i rgb [6];
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  longlong local_98 [2];
  longlong local_88 [2];
  longlong local_78 [2];
  longlong local_68 [2];
  longlong local_58 [2];
  longlong local_48 [3];
  
  argb_00 = argb;
  for (lVar3 = 0; lVar3 < (int)(width & 0xfffffff0); lVar3 = lVar3 + 0x10) {
    RGB32PackedToPlanar_SSE2(argb_00,&local_98);
    ConvertRGBToY_SSE2(&local_98,&local_78,&local_58,(__m128i *)&local_a8);
    ConvertRGBToY_SSE2(&local_88,&local_68,(__m128i *)local_48,(__m128i *)&local_b8);
    puVar1 = y + lVar3;
    *puVar1 = (0 < local_a8) * (local_a8 < 0x100) * (char)local_a8 - (0xff < local_a8);
    puVar1[1] = (0 < sStack_a6) * (sStack_a6 < 0x100) * (char)sStack_a6 - (0xff < sStack_a6);
    puVar1[2] = (0 < sStack_a4) * (sStack_a4 < 0x100) * (char)sStack_a4 - (0xff < sStack_a4);
    puVar1[3] = (0 < sStack_a2) * (sStack_a2 < 0x100) * (char)sStack_a2 - (0xff < sStack_a2);
    puVar1[4] = (0 < sStack_a0) * (sStack_a0 < 0x100) * (char)sStack_a0 - (0xff < sStack_a0);
    puVar1[5] = (0 < sStack_9e) * (sStack_9e < 0x100) * (char)sStack_9e - (0xff < sStack_9e);
    puVar1[6] = (0 < sStack_9c) * (sStack_9c < 0x100) * (char)sStack_9c - (0xff < sStack_9c);
    puVar1[7] = (0 < sStack_9a) * (sStack_9a < 0x100) * (char)sStack_9a - (0xff < sStack_9a);
    puVar1[8] = (0 < local_b8) * (local_b8 < 0x100) * (char)local_b8 - (0xff < local_b8);
    puVar1[9] = (0 < sStack_b6) * (sStack_b6 < 0x100) * (char)sStack_b6 - (0xff < sStack_b6);
    puVar1[10] = (0 < sStack_b4) * (sStack_b4 < 0x100) * (char)sStack_b4 - (0xff < sStack_b4);
    puVar1[0xb] = (0 < sStack_b2) * (sStack_b2 < 0x100) * (char)sStack_b2 - (0xff < sStack_b2);
    puVar1[0xc] = (0 < sStack_b0) * (sStack_b0 < 0x100) * (char)sStack_b0 - (0xff < sStack_b0);
    puVar1[0xd] = (0 < sStack_ae) * (sStack_ae < 0x100) * (char)sStack_ae - (0xff < sStack_ae);
    puVar1[0xe] = (0 < sStack_ac) * (sStack_ac < 0x100) * (char)sStack_ac - (0xff < sStack_ac);
    puVar1[0xf] = (0 < sStack_aa) * (sStack_aa < 0x100) * (char)sStack_aa - (0xff < sStack_aa);
    argb_00 = argb_00 + 0x10;
  }
  for (; lVar3 < width; lVar3 = lVar3 + 1) {
    uVar2 = argb[lVar3];
    y[lVar3] = (uint8_t)((uVar2 & 0xff) * 0x1914 + (uVar2 >> 0x10 & 0xff) * 0x41c7 +
                         (uVar2 >> 8 & 0xff) * 0x8123 + 0x108000 >> 0x10);
  }
  return;
}

Assistant:

static void ConvertARGBToY_SSE2(const uint32_t* WEBP_RESTRICT argb,
                                uint8_t* WEBP_RESTRICT y, int width) {
  const int max_width = width & ~15;
  int i;
  for (i = 0; i < max_width; i += 16) {
    __m128i Y0, Y1, rgb[6];
    RGB32PackedToPlanar_SSE2(&argb[i], rgb);
    ConvertRGBToY_SSE2(&rgb[0], &rgb[2], &rgb[4], &Y0);
    ConvertRGBToY_SSE2(&rgb[1], &rgb[3], &rgb[5], &Y1);
    STORE_16(_mm_packus_epi16(Y0, Y1), y + i);
  }
  for (; i < width; ++i) {   // left-over
    const uint32_t p = argb[i];
    y[i] = VP8RGBToY((p >> 16) & 0xff, (p >> 8) & 0xff, (p >>  0) & 0xff,
                     YUV_HALF);
  }
}